

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

Symbol * __thiscall
slang::ast::Lookup::selectChild
          (Lookup *this,Symbol *initialSymbol,
          span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors,
          ASTContext *context,LookupResult *result)

{
  SyntaxNode *this_00;
  SVInt *this_01;
  BumpAllocator *args;
  int iVar1;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *this_02;
  bool bVar2;
  logic_t lVar3;
  SymbolKind SVar4;
  Diagnostic *pDVar5;
  _Optional_payload_base<int> _Var6;
  _Storage<slang::ConstantRange,_true> _Var7;
  undefined7 extraout_var;
  reference extraout_RAX;
  reference pEVar8;
  _Optional_payload_base<int> args_00;
  int iVar9;
  __extent_storage<18446744073709551615UL> this_03;
  DiagCode code;
  ulong uVar10;
  _Storage<int,_true> _Var11;
  Symbol *source;
  _Storage<int,_true> _Var12;
  long lVar13;
  SyntaxNode *this_04;
  SyntaxNode *this_05;
  SourceRange SVar14;
  optional<slang::ConstantRange> oVar15;
  int32_t translated;
  int32_t idx;
  ConstantRange newRange;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_c0;
  ulong local_b8;
  AssertionInstanceDetails **local_b0;
  _Storage<int,_true> local_a8;
  SyntaxNode *local_a0;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  ConstantRange local_80;
  long local_78;
  _Storage<int,_true> local_70;
  ulong local_68;
  _Optional_payload_base<int> local_60;
  SyntaxNode *local_58;
  SymbolKind *local_50;
  SourceLocation local_48;
  Token local_40;
  
  this_03 = selectors._M_extent._M_extent_value;
  if (selectors._M_ptr != (pointer)0x0) {
    local_50 = &initialSymbol->kind + (long)selectors._M_ptr * 2;
    local_b0 = &context[5].assertionInstance;
    local_98 = (SmallVectorBase<slang::ast::HierarchicalReference::Element> *)&context[4].flags;
    this_05 = (SyntaxNode *)0x0;
    do {
      this_04 = *(SyntaxNode **)initialSymbol;
      iVar9 = *(int *)this;
      if ((iVar9 == 0x31) || (iVar9 == 0x38)) {
        this_00 = this_04[1].previewNode;
        if (this_00 == (SyntaxNode *)0x0) {
          lVar13 = *(long *)this_03._M_extent_value;
          SVar14 = slang::syntax::SyntaxNode::sourceRange(this_04);
          Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar13 + 8),(DiagCode)0x15000a,
                           SVar14);
          goto LAB_002ed88f;
        }
        if (this_05 != (SyntaxNode *)0x0) {
          lVar13 = *(long *)this_03._M_extent_value;
          SVar14 = slang::syntax::SyntaxNode::sourceRange(this_04);
          pDVar5 = Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar13 + 8),
                                    (DiagCode)0x940007,SVar14);
          SVar14 = slang::syntax::SyntaxNode::sourceRange(this_05);
          Diagnostic::operator<<(pDVar5,SVar14);
          goto LAB_002ed88f;
        }
        if (this_00->kind == BitSelect) {
          _Var6 = (_Optional_payload_base<int>)
                  ASTContext::evalInteger
                            ((ASTContext *)this_03._M_extent_value,
                             *(ExpressionSyntax **)(this_00 + 1),(bitmask<slang::ast::ASTFlags>)0x0)
          ;
          this_02 = local_98;
          args_00._M_payload = (_Storage<int,_true>)0x0;
          args_00._M_engaged = false;
          args_00._5_3_ = 0;
          if (((ulong)_Var6 & 0x100000000) != 0) {
            if (*(int *)this == 0x31) {
              if (*(long *)((long)this + 0x80) != 0) {
                _Var11 = _Var6._M_payload;
                bVar2 = ConstantRange::containsPoint
                                  ((ConstantRange *)((long)this + 0x88),_Var11._M_value);
                if (bVar2) {
                  SVar4 = (((GenerateBlockSymbol *)((long)this + 0x88))->super_Symbol).kind;
                  if ((int)*(SymbolKind *)((long)this + 0x8c) < (int)SVar4) {
                    SVar4 = *(SymbolKind *)((long)this + 0x8c);
                  }
                  local_c0.val._0_4_ = _Var11._M_value - SVar4;
                  args_00 = *(_Optional_payload_base<int> *)
                             (&(*(SyntaxNode **)((long)this + 0x78))->kind +
                             (long)(int)(_Var11._M_value - SVar4) * 2);
                  SmallVectorBase<slang::ast::HierarchicalReference::Element>::
                  emplace_back<slang::ast::Symbol_const&,int&>
                            (this_02,(Symbol *)args_00,(int *)&local_c0.val);
                  goto LAB_002edc43;
                }
                lVar13 = *(long *)this_03._M_extent_value;
                SVar14 = slang::syntax::SyntaxNode::sourceRange(this_00);
                pDVar5 = Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar13 + 8),
                                          (DiagCode)0x2d000a,SVar14);
LAB_002edc1e:
                local_c0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)_Var11._M_value;
                std::
                vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                ::emplace_back<long>(&pDVar5->args,(long *)&local_c0.val);
                Diagnostic::addNote(pDVar5,(DiagCode)0x50001,*(SourceLocation *)((long)this + 0x18))
                ;
              }
            }
            else if (*(char *)((long)this + 0x8c) == '\x01') {
              local_90._M_len = local_90._M_len & 0xffffffff00000000;
              local_78 = *(long *)((long)this + 0x80);
              uVar10 = (ulong)(local_78 == 0);
              local_a0 = this_00;
              _local_70 = _Var6;
              if (local_78 != 0) {
                local_58 = *(SyntaxNode **)((long)this + 0x78);
                local_78 = local_78 << 3;
                lVar13 = 0;
                uVar10 = 0;
                local_60 = (_Optional_payload_base<int>)this;
                do {
                  _Var6 = *(_Optional_payload_base<int> *)((long)&local_58->kind + lVar13);
                  this_01 = *(SVInt **)((long)_Var6 + 0x80);
                  _local_a8 = args_00;
                  local_68 = uVar10;
                  SVInt::SVInt<int>((SVInt *)&local_c0,local_70._M_value);
                  lVar3 = SVInt::operator==(this_01,(SVInt *)&local_c0);
                  pEVar8 = (reference)CONCAT71(extraout_var,lVar3.value);
                  if (((0x40 < (uint)local_b8) || ((local_b8 & 0x10000000000) != 0)) &&
                     ((SyntaxKind *)local_c0.val != (SyntaxKind *)0x0)) {
                    operator_delete__(local_c0.pVal);
                    pEVar8 = extraout_RAX;
                  }
                  if (lVar3.value != '\0' && (lVar3.value != 0x80 && lVar3.value != '@')) {
                    pEVar8 = SmallVectorBase<slang::ast::HierarchicalReference::Element>::
                             emplace_back<slang::ast::GenerateBlockSymbol_const&,int&>
                                       (local_98,(GenerateBlockSymbol *)_Var6,(int *)&local_90);
                    args_00 = _Var6;
                  }
                  else {
                    local_90._M_len = CONCAT44(local_90._M_len._4_4_,(int)local_90._M_len + 1);
                    args_00 = _local_a8;
                  }
                  uVar10 = local_68;
                  this = (Lookup *)local_60;
                  if (lVar3.value != '\0' && (lVar3.value != 0x80 && lVar3.value != '@')) break;
                  lVar13 = lVar13 + 8;
                  uVar10 = CONCAT71((int7)((ulong)pEVar8 >> 8),local_78 == lVar13);
                } while (local_78 != lVar13);
              }
              if ((uVar10 & 1) != 0) {
                lVar13 = *(long *)this_03._M_extent_value;
                SVar14 = slang::syntax::SyntaxNode::sourceRange(local_a0);
                pDVar5 = Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar13 + 8),
                                          (DiagCode)0x2d000a,SVar14);
                _Var11._M_value = local_70._M_value;
                goto LAB_002edc1e;
              }
              goto LAB_002edc43;
            }
            args_00._M_payload = (_Storage<int,_true>)0x0;
            args_00._M_engaged = false;
            args_00._5_3_ = 0;
          }
LAB_002edc43:
          this_04 = (SyntaxNode *)0x0;
          if (args_00 == (_Optional_payload_base<int>)0x0) {
LAB_002edeca:
            bVar2 = false;
            this._0_4_ = (_Storage<int,_true>)0x0;
            this._4_1_ = false;
            this._5_3_ = 0;
          }
          else {
            this_04 = (SyntaxNode *)0x0;
LAB_002edeb8:
            bVar2 = true;
            this = (Lookup *)args_00;
          }
        }
        else {
          if (iVar9 == 0x31) {
            if (*(long *)((long)this + 0x80) == 0) {
LAB_002edeb1:
              args_00._M_payload = (_Storage<int,_true>)0x0;
              args_00._M_engaged = false;
              args_00._5_3_ = 0;
            }
            else {
              _Var7._M_value =
                   (ConstantRange)
                   ASTContext::evalInteger
                             ((ASTContext *)this_03._M_extent_value,
                              *(ExpressionSyntax **)(this_00 + 1),(bitmask<slang::ast::ASTFlags>)0x0
                             );
              _Var6 = (_Optional_payload_base<int>)
                      ASTContext::evalInteger
                                ((ASTContext *)this_03._M_extent_value,
                                 *(ExpressionSyntax **)(this_00 + 2),
                                 (bitmask<slang::ast::ASTFlags>)0x0);
              args_00._M_payload = (_Storage<int,_true>)0x0;
              args_00._M_engaged = false;
              args_00._5_3_ = 0;
              if (((ulong)_Var6 & 0x100000000) != 0 && ((ulong)_Var7 & 0x100000000) != 0) {
                _Var11._M_value = _Var7._M_value.left;
                _Var12 = _Var6._M_payload;
                if (this_00->kind != SimpleRangeSelect) {
                  if (_Var12._M_value < 1) {
                    lVar13 = *(long *)this_03._M_extent_value;
                    SVar14 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(this_00 + 2));
                    Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar13 + 8),
                                     (DiagCode)0x80003,SVar14);
                  }
                  else {
                    oVar15 = ConstantRange::getIndexedRange
                                       (_Var11._M_value,_Var12._M_value,
                                        *(int *)((long)this + 0x8c) <=
                                        (int)(((GenerateBlockSymbol *)((long)this + 0x88))->
                                             super_Symbol).kind,
                                        this_00->kind == AscendingRangeSelect);
                    _Var7 = oVar15.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload
                            .super__Optional_payload_base<slang::ConstantRange>._M_payload;
                    if (((undefined1  [12])
                         oVar15.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                         super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1)
                        == (undefined1  [12])0x0) {
                      lVar13 = *(long *)this_03._M_extent_value;
                      SVar14 = slang::syntax::SyntaxNode::sourceRange(this_00);
                      Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar13 + 8),
                                       (DiagCode)0x8b0007,SVar14);
                      _Var7 = (_Storage<slang::ConstantRange,_true>)0x0;
                      _Var6._M_payload = (_Storage<int,_true>)0x0;
                      _Var6._M_engaged = false;
                      _Var6._5_3_ = 0;
                    }
                    else {
                      _Var6 = (_Optional_payload_base<int>)((ulong)_Var7 >> 0x20);
                    }
                    if (((undefined1  [12])
                         oVar15.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                         super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1)
                        != (undefined1  [12])0x0) goto LAB_002edccb;
                  }
                  goto LAB_002edeb1;
                }
                if (_Var12._M_value <= _Var11._M_value ==
                    *(int *)((long)this + 0x8c) <=
                    (int)(((GenerateBlockSymbol *)((long)this + 0x88))->super_Symbol).kind) {
LAB_002edccb:
                  _Var11._M_value = _Var7._M_value.left;
                  _local_a8 = _Var6;
                  local_a0 = this_00;
                  bVar2 = ConstantRange::containsPoint
                                    ((ConstantRange *)((long)this + 0x88),_Var11._M_value);
                  if ((bVar2) &&
                     (bVar2 = ConstantRange::containsPoint
                                        ((ConstantRange *)((long)this + 0x88),local_a8._M_value),
                     bVar2)) {
                    SVar4 = (((GenerateBlockSymbol *)((long)this + 0x88))->super_Symbol).kind;
                    if ((int)*(SymbolKind *)((long)this + 0x8c) < (int)SVar4) {
                      SVar4 = *(SymbolKind *)((long)this + 0x8c);
                    }
                    _Var12 = local_a8;
                    iVar9 = _Var12._M_value - SVar4;
                    iVar1 = _Var11._M_value - SVar4;
                    if (_Var11._M_value - _Var12._M_value != 0 && _Var12._M_value <= _Var11._M_value
                       ) {
                      iVar9 = _Var11._M_value - SVar4;
                      iVar1 = _Var12._M_value - SVar4;
                    }
                    uVar10 = (long)(iVar9 - iVar1) + 1;
                    local_b8 = *(long *)((long)this + 0x80) - (long)iVar1;
                    if (uVar10 != 0xffffffffffffffff) {
                      local_b8 = uVar10;
                    }
                    local_c0.pVal =
                         (uint64_t *)
                         (&(*(SyntaxNode **)((long)this + 0x78))->kind + (long)iVar1 * 2);
                    local_80.left = _Var11._M_value - (int)_Var12;
                    if (_Var11._M_value - (int)_Var12 == 0 || _Var11._M_value < _Var12._M_value) {
                      local_80.left = -(_Var11._M_value - _Var12._M_value);
                    }
                    local_80.right = 0;
                    if (_Var11._M_value < _Var12._M_value) {
                      local_80 = (ConstantRange)((ulong)(uint)local_80.left << 0x20);
                    }
                    args = (BumpAllocator *)**(undefined8 **)this_03._M_extent_value;
                    local_90._M_len = 0;
                    local_90._M_str = "";
                    local_40 = slang::syntax::SyntaxNode::getFirstToken(local_a0);
                    local_48 = parsing::Token::location(&local_40);
                    args_00 = (_Optional_payload_base<int>)
                              BumpAllocator::
                              emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,std::span<slang::ast::Symbol_const*const,18446744073709551615ul>&,slang::ConstantRange&>
                                        (args,(Compilation *)args,&local_90,&local_48,
                                         (span<const_slang::ast::Symbol_*const,_18446744073709551615UL>
                                          *)&local_c0,&local_80);
                    local_90._M_len = CONCAT44(iVar9,iVar1);
                    SmallVectorBase<slang::ast::HierarchicalReference::Element>::
                    emplace_back<slang::ast::InstanceArraySymbol&,std::pair<int,int>>
                              (local_98,(InstanceArraySymbol *)args_00,(pair<int,_int> *)&local_90);
                    goto LAB_002edeb3;
                  }
                  lVar13 = *(long *)this_03._M_extent_value;
                  SVar14 = slang::syntax::SyntaxNode::sourceRange(local_a0);
                  source = *(Symbol **)(lVar13 + 8);
                  code.subsystem = Lookup;
                  code.code = 2;
                }
                else {
                  iVar9 = _Var11._M_value - _Var12._M_value;
                  if (_Var11._M_value - _Var12._M_value == 0 || _Var11._M_value < _Var12._M_value) {
                    iVar9 = -(_Var11._M_value - _Var12._M_value);
                  }
                  if (0xfffffffd < iVar9 - 1U) goto LAB_002edccb;
                  lVar13 = *(long *)this_03._M_extent_value;
                  _local_a8 = _Var6;
                  SVar14 = slang::syntax::SyntaxNode::sourceRange(this_00);
                  source = *(Symbol **)(lVar13 + 8);
                  code.subsystem = Lookup;
                  code.code = 0x11;
                }
                pDVar5 = Diagnostics::add((Diagnostics *)local_b0,source,code,SVar14);
                local_c0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)_Var7._M_value.left;
                std::
                vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                ::emplace_back<long>(&pDVar5->args,(long *)&local_c0.val);
                local_c0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)local_a8._M_value;
                std::
                vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                ::emplace_back<long>(&pDVar5->args,(long *)&local_c0.val);
                local_c0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                           (long)(int)(((GenerateBlockSymbol *)((long)this + 0x88))->super_Symbol).
                                      kind;
                std::
                vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                ::emplace_back<long>(&pDVar5->args,(long *)&local_c0.val);
                local_c0 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                           (long)*(int *)((long)this + 0x8c);
                std::
                vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                ::emplace_back<long>(&pDVar5->args,(long *)&local_c0.val);
                goto LAB_002edeb1;
              }
            }
LAB_002edeb3:
            if (args_00 == (_Optional_payload_base<int>)0x0) goto LAB_002edeca;
            goto LAB_002edeb8;
          }
          lVar13 = *(long *)this_03._M_extent_value;
          SVar14 = slang::syntax::SyntaxNode::sourceRange(this_04);
          Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar13 + 8),(DiagCode)0x15000a,
                           SVar14);
          bVar2 = false;
        }
      }
      else {
        lVar13 = *(long *)this_03._M_extent_value;
        SVar14 = slang::syntax::SyntaxNode::sourceRange(this_04);
        pDVar5 = Diagnostics::add((Diagnostics *)local_b0,*(Symbol **)(lVar13 + 8),
                                  (DiagCode)0x2e000a,SVar14);
        Diagnostic::operator<<(pDVar5,*(string_view *)((long)this + 8));
        Diagnostic::addNote(pDVar5,(DiagCode)0x50001,*(SourceLocation *)((long)this + 0x18));
LAB_002ed88f:
        bVar2 = false;
        this_04 = this_05;
      }
      if (!bVar2) {
        return (Symbol *)0x0;
      }
      initialSymbol = (Symbol *)&initialSymbol->name;
      this_05 = this_04;
    } while (initialSymbol != (Symbol *)local_50);
  }
  return (Symbol *)(_Optional_payload_base<int>)this;
}

Assistant:

const Symbol* Lookup::selectChild(const Symbol& initialSymbol,
                                  std::span<const ElementSelectSyntax* const> selectors,
                                  const ASTContext& context, LookupResult& result) {
    const Symbol* symbol = &initialSymbol;
    const SyntaxNode* prevRangeSelect = nullptr;
    for (const ElementSelectSyntax* syntax : selectors) {
        if (symbol->kind != SymbolKind::InstanceArray &&
            symbol->kind != SymbolKind::GenerateBlockArray) {
            // I think it's safe to assume that the symbol name here will not be empty
            // because if it was, it'd be an instance array or generate array.
            auto& diag = result.addDiag(*context.scope, diag::ScopeNotIndexable,
                                        syntax->sourceRange());
            diag << symbol->name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return nullptr;
        }

        auto selectorError = [&]() -> const Symbol* {
            result.addDiag(*context.scope, diag::InvalidScopeIndexExpression,
                           syntax->sourceRange());
            return nullptr;
        };

        if (!syntax->selector)
            return selectorError();

        if (prevRangeSelect) {
            result.addDiag(*context.scope, diag::SelectAfterRangeSelect, syntax->sourceRange())
                << prevRangeSelect->sourceRange();
            return nullptr;
        }

        switch (syntax->selector->kind) {
            case SyntaxKind::BitSelect:
                symbol = selectSingleChild(*symbol, syntax->selector->as<BitSelectSyntax>(),
                                           context, result);
                if (!symbol)
                    return nullptr;
                break;
            case SyntaxKind::SimpleRangeSelect:
            case SyntaxKind::AscendingRangeSelect:
            case SyntaxKind::DescendingRangeSelect:
                prevRangeSelect = syntax;
                if (symbol->kind != SymbolKind::InstanceArray)
                    return selectorError();

                symbol = selectChildRange(symbol->as<InstanceArraySymbol>(),
                                          syntax->selector->as<RangeSelectSyntax>(), context,
                                          result);
                if (!symbol)
                    return nullptr;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    return symbol;
}